

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

int Cudd_SetVarMap(DdManager *manager,DdNode **x,DdNode **y,int n)

{
  uint uVar1;
  DdNode *pDVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __size;
  
  if (manager->map == (int *)0x0) {
    __size = (long)manager->maxSize * 4;
    piVar3 = (int *)malloc(__size);
    manager->map = piVar3;
    if (piVar3 == (int *)0x0) {
      manager->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    manager->memused = manager->memused + __size;
  }
  else {
    cuddCacheFlush(manager);
  }
  for (lVar4 = 0; lVar4 < manager->size; lVar4 = lVar4 + 1) {
    manager->map[lVar4] = (int)lVar4;
  }
  uVar5 = 0;
  uVar6 = (ulong)(uint)n;
  if (n < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = y[uVar5]->index;
    piVar3 = manager->map;
    pDVar2 = x[uVar5];
    piVar3[pDVar2->index] = uVar1;
    piVar3[uVar1] = pDVar2->index;
  }
  return 1;
}

Assistant:

int
Cudd_SetVarMap (
  DdManager *manager /* DD manager */,
  DdNode **x /* first array of variables */,
  DdNode **y /* second array of variables */,
  int n /* length of both arrays */)
{
    int i;

    if (manager->map != NULL) {
        cuddCacheFlush(manager);
    } else {
        manager->map = ABC_ALLOC(int,manager->maxSize);
        if (manager->map == NULL) {
            manager->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        manager->memused += sizeof(int) * manager->maxSize;
    }
    /* Initialize the map to the identity. */
    for (i = 0; i < manager->size; i++) {
        manager->map[i] = i;
    }
    /* Create the map. */
    for (i = 0; i < n; i++) {
        manager->map[x[i]->index] = y[i]->index;
        manager->map[y[i]->index] = x[i]->index;
    }
    return(1);

}